

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompactCounters.h
# Opt level: O3

uint32 __thiscall
Js::CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields>::Set
          (CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields> *this,
          CounterFields typeEnum,uint32 val,FunctionBody *host)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
LAB_007759b6:
  do {
    switch(this->fieldSize) {
    case '\0':
      if ((val != 0) || ((this->fields).ptr != (Fields *)0x0)) {
switchD_007759c7_caseD_3:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/CompactCounters.h"
                                    ,0x6e,"(fieldSize == 0 && this->fields == nullptr && val == 0)",
                                    "fieldSize == 0 && this->fields == nullptr && val == 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      return val;
    case '\x01':
      if (val < 0x100) {
        (this->fields).ptr[typeEnum] = SUB41(val,0);
        return val;
      }
      if (val < 0x10000) {
        AllocCounters<unsigned_short>(this,host);
        this = &host->counters;
        goto LAB_007759b6;
      }
      break;
    case '\x02':
      if (val < 0x10000) {
        *(short *)((this->fields).ptr + (ulong)typeEnum * 2) = (short)val;
        return val;
      }
      break;
    default:
      goto switchD_007759c7_caseD_3;
    case '\x04':
      *(uint32 *)((this->fields).ptr + (ulong)typeEnum * 4) = val;
      return val;
    }
    AllocCounters<unsigned_int>(this,host);
    this = &host->counters;
  } while( true );
}

Assistant:

uint32 Set(CountT typeEnum, uint32 val, T* host)
        {
            uint8 type = static_cast<uint8>(typeEnum);
            if (fieldSize == 1)
            {
                if (val <= UINT8_MAX)
                {
                    return this->fields->u8Fields[type] = static_cast<uint8>(val);
                }
                else
                {
                    (val <= UINT16_MAX) ? AllocCounters<uint16>(host) : AllocCounters<uint32>(host);
                    return host->counters.Set(typeEnum, val, host);
                }
            }

            if (fieldSize == 2)
            {
                if (val <= UINT16_MAX)
                {
                    return this->fields->u16Fields[type] = static_cast<uint16>(val);
                }
                else
                {
                    AllocCounters<uint32>(host);
                    return host->counters.Set(typeEnum, val, host);
                }
            }

            if (fieldSize == 4)
            {
                return this->fields->u32Fields[type] = val;
            }

            Assert(fieldSize == 0 && this->fields == nullptr && val == 0); // OOM when allocating the counters structure
            return val;
        }